

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_gz.c
# Opt level: O0

void * nhr_gz_decompress(void *buff,size_t buff_size,size_t *decompressed_size,uchar method)

{
  int iVar1;
  int iVar2;
  int local_c0;
  int result;
  int available_size;
  size_t out_size;
  size_t writed;
  Bytef *out_buff;
  z_stream zip;
  uchar method_local;
  size_t *decompressed_size_local;
  size_t buff_size_local;
  void *buff_local;
  
  out_size = 0;
  _result = 0x200;
  local_c0 = -1;
  if ((buff == (void *)0x0) || (buff_size == 0)) {
    buff_local = (void *)0x0;
  }
  else {
    zip.reserved._7_1_ = method;
    memset(&out_buff,0,0x70);
    if (zip.reserved._7_1_ == '\0') {
      out_buff = (Bytef *)buff;
      zip.next_in._0_4_ = (int)buff_size;
      local_c0 = inflateInit_(&out_buff,"1.2.11",0x70);
    }
    else {
      iVar1 = nhr_gz_is_gzip_file((Bytef *)buff,buff_size);
      if (iVar1 != 0) {
        zip.next_in._0_4_ = (int)buff_size + -0x12;
        out_buff = (Bytef *)((long)buff + 10);
        local_c0 = inflateInit2_(&out_buff,0xfffffff1,"1.2.11",0x70);
      }
    }
    if (local_c0 == 0) {
      writed = (size_t)nhr_malloc(0x200);
      zip.next_out._0_4_ = 0x200;
      do {
        zip.total_in = writed + out_size;
        iVar1 = inflate(&out_buff,0);
        if ((iVar1 + 4U < 3) || (iVar1 == 2)) {
          nhr_free((void *)writed);
          inflateEnd(&out_buff);
          return (void *)0x0;
        }
        iVar2 = 0x200 - (int)zip.next_out;
        if (iVar2 < 1) {
          inflateEnd(&out_buff);
          nhr_free((void *)writed);
          return (void *)0x0;
        }
        out_size = (long)iVar2 + out_size;
        if (out_size < _result) {
          zip.next_out._0_4_ = 0x200 - iVar2;
        }
        else {
          _result = _result + 0x200;
          writed = (size_t)nhr_realloc((void *)writed,_result);
          zip.next_out._0_4_ = 0x200;
        }
      } while (iVar1 != 1);
      inflateEnd(&out_buff);
      if (decompressed_size != (size_t *)0x0) {
        *decompressed_size = out_size;
      }
      buff_local = (void *)writed;
    }
    else {
      buff_local = (void *)0x0;
    }
  }
  return buff_local;
}

Assistant:

void * nhr_gz_decompress(const void * buff,
						 const size_t buff_size,
						 size_t * decompressed_size,
						 const unsigned char method) {
	z_stream zip;
	Bytef * out_buff = NULL;
	size_t writed = 0, out_size = NHR_GZ_CHUNK_SIZE;
	int available_size = 0, result = Z_ERRNO;

	if (!buff || buff_size == 0) {
		return NULL;
	}
	memset(&zip, 0, sizeof(z_stream));

	if (method == NHR_GZ_METHOD_DEFLATE) {
		zip.avail_in = (uInt)buff_size;
		zip.next_in = (Bytef *)buff;
		result = inflateInit(&zip);
	} else if (nhr_gz_is_gzip_file((Bytef *)buff, buff_size)) {
		zip.avail_in = (uInt)(buff_size - NHR_GZ_HEADER_FOOTER_SIZE);
		zip.next_in = (Bytef *)buff + NHR_GZ_HEADER_SIZE;
		result = inflateInit2(&zip, NHR_GZ_WINDOWS_BITS);
	}

	if (result != Z_OK) {
		return NULL;
	}

	out_buff = (Bytef *)nhr_malloc(NHR_GZ_CHUNK_SIZE);

	zip.avail_out = NHR_GZ_CHUNK_SIZE;

	do {
		zip.next_out = out_buff + writed;

		result = inflate(&zip, Z_NO_FLUSH);
		switch (result) {
			case Z_NEED_DICT:
				result = Z_DATA_ERROR;
			case Z_DATA_ERROR:
			case Z_MEM_ERROR:
			case Z_STREAM_ERROR:
				nhr_free(out_buff);
				inflateEnd(&zip);
				return NULL;
		}
		available_size = ((int)NHR_GZ_CHUNK_SIZE) - zip.avail_out;
		if (available_size > 0) {
			writed += available_size;
			if (writed < out_size) {
				zip.avail_out = ((int)NHR_GZ_CHUNK_SIZE) - available_size;
			} else {
				out_size += NHR_GZ_CHUNK_SIZE;
				out_buff = (Bytef *)nhr_realloc(out_buff, out_size);
				zip.avail_out = NHR_GZ_CHUNK_SIZE;
			}
		} else {
			inflateEnd(&zip);
			nhr_free(out_buff);
			return NULL;
		}
	} while (result != Z_STREAM_END);

	inflateEnd(&zip);

	if (decompressed_size) {
		*decompressed_size = writed;
	}
	return out_buff;
}